

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<unsigned_char,_Centaurus::IndexVector>::add_transition
          (NFABaseState<unsigned_char,_Centaurus::IndexVector> *this,CharClass<unsigned_char> *cc,
          int dest,bool long_flag)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  CharClass<unsigned_char> *this_01;
  NFATransition<unsigned_char> *tr;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range3;
  bool long_flag_local;
  CharClass<unsigned_char> *pCStack_18;
  int dest_local;
  CharClass<unsigned_char> *cc_local;
  NFABaseState<unsigned_char,_Centaurus::IndexVector> *this_local;
  
  __range3._3_1_ = long_flag;
  __range3._4_4_ = dest;
  pCStack_18 = cc;
  cc_local = (CharClass<unsigned_char> *)this;
  bVar1 = CharClass<unsigned_char>::is_epsilon(cc);
  if (!bVar1) {
    __end0 = std::
             vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ::begin(&this->m_transitions);
    tr = (NFATransition<unsigned_char> *)
         std::
         vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
         ::end(&this->m_transitions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                       *)&tr), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                ::operator*(&__end0);
      iVar2 = NFATransition<unsigned_char>::dest(this_00);
      if (iVar2 == __range3._4_4_) {
        this_01 = NFATransition<unsigned_char>::label(this_00);
        bVar1 = CharClass<unsigned_char>::is_epsilon(this_01);
        if (!bVar1) {
          NFATransition<unsigned_char>::add_class(this_00,pCStack_18);
          if ((__range3._3_1_ & 1) == 0) {
            return;
          }
          NFATransition<unsigned_char>::set_long(this_00,true);
          return;
        }
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
      ::operator++(&__end0);
    }
  }
  std::
  vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>
  ::emplace_back<Centaurus::CharClass<unsigned_char>const&,int&,bool&>
            ((vector<Centaurus::NFATransition<unsigned_char>,std::allocator<Centaurus::NFATransition<unsigned_char>>>
              *)&this->m_transitions,pCStack_18,(int *)((long)&__range3 + 4),
             (bool *)((long)&__range3 + 3));
  return;
}

Assistant:

void add_transition(const CharClass<TCHAR>& cc, int dest, bool long_flag = false)
    {
        if (!cc.is_epsilon())
        {
            for (auto& tr : m_transitions)
            {
                if (tr.dest() == dest && !tr.label().is_epsilon())
                {
                    tr.add_class(cc);
                    if (long_flag) tr.set_long();
                    return;
                }
            }
        }
        m_transitions.emplace_back(cc, dest, long_flag);
    }